

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlneuron.cxx
# Opt level: O1

void __thiscall
MlNeuron::calibrate(MlNeuron *this,int isi,int spikes,int maxtime,NoiseSource *noises)

{
  return;
}

Assistant:

void MlNeuron::calibrate(int isi, int spikes, int maxtime, NoiseSource *noises)
{
/*	double stepsize = 1.0; // starting stepsize
	int steps = 20; // multiply stepsize with this
	ifneuronTheta = mlneuronMembrane.getStartingValue();
	int direction = 1; // current direction 1-up, -1-down

	// new interval estimator, measuring time in units
	IntervalEstimator estimator(EST_MEAN, this, xTime);
	
	NullStream devnull;
	
	for( int k=0; k<1000; k++) {
		
		// test fpt
		xTime->run( spikes, this, maxtime, devnull );
		
		// adjust threshold
		double mean = estimator.getEstimate(EST_MEAN).to_d() / xTime->dt;
		if( mean==0.0 ) mean = 2*isi;
		if(mean < isi)
			if (direction == 1) {
				// mean too large and direction up - decrease stepsize and turn
				stepsize *= 0.8;
				direction *= -1;
			} else
				// mean too large and direction down - increase stepsize and go on
				stepsize *= 1.1;
		else
			if (direction == -1) {
				// mean too small and direction down - decrease stepsize and turn
				stepsize *= 0.8;
				direction *= -1;
			} else
				// mean too small and direction up - increase stepsize and go on
				stepsize *= 1.1;
		ifneuronTheta -= direction * stepsize * steps;
		
		// note to the user
		cout << "\rerror: " << stepsize << " threshold: " << ifneuronTheta << " spike rate: " << 1.0/(mean*xTime->dt) << "Hz      " << flush;
		
		// early stopping
		if( stepsize<0.001 ) {
			cout << "\rcalibrated neuron after " << k << " steps.\t\t\t\t\t" << endl;
			break;
		}
	}
	
	init();
*/}